

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::HasInternalHasMethod(FieldDescriptor *field)

{
  char cVar1;
  bool bVar2;
  
  cVar1 = google::protobuf::internal::cpp::HasHasbit(field);
  if (cVar1 == '\0') {
    bVar2 = *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 10;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HasInternalHasMethod(const FieldDescriptor* field) {
  return !HasHasbit(field) &&
         field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE;
}